

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

qsizetype QtPrivate::indexOf<QPointer<QMdiSubWindow>,QPointer<QMdiSubWindow>>
                    (QList<QPointer<QMdiSubWindow>_> *vector,QPointer<QMdiSubWindow> *u,
                    qsizetype from)

{
  ulong uVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  ulong uVar6;
  long lVar7;
  QObject *pQVar8;
  QObject *pQVar9;
  
  uVar1 = (vector->d).size;
  uVar6 = from;
  if (from < 0) {
    uVar6 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar6 = 0;
    }
  }
  qVar5 = -1;
  if (uVar6 < uVar1) {
    pQVar2 = (vector->d).ptr;
    pDVar3 = (u->wp).d;
    lVar7 = uVar6 * 0x10 + -0x10;
    do {
      if (uVar1 * -0x10 + lVar7 == -0x10) {
        return -1;
      }
      lVar4 = *(long *)((long)&pQVar2[1].wp.d + lVar7);
      if ((lVar4 == 0) || (*(int *)(lVar4 + 4) == 0)) {
        pQVar8 = (QObject *)0x0;
      }
      else {
        pQVar8 = *(QObject **)((long)&pQVar2[1].wp.value + lVar7);
      }
      if (pDVar3 == (Data *)0x0) {
        pQVar9 = (QObject *)0x0;
      }
      else {
        pQVar9 = (u->wp).value;
        if (*(int *)(pDVar3 + 4) == 0) {
          pQVar9 = (QObject *)0x0;
        }
      }
      lVar7 = lVar7 + 0x10;
    } while (pQVar8 != pQVar9);
    qVar5 = lVar7 >> 4;
  }
  return qVar5;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }